

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_same_stdout_stderr(void)

{
  int iVar1;
  __uid_t _Var2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  __sighandler_t p_Var5;
  uv_process_options_t *loop;
  passwd *ppVar6;
  anon_union_8_2_26168aa3_for_data aVar7;
  ssize_t sVar8;
  uv_buf_t *buf;
  uv_process_t *puVar9;
  uv_process_t *puVar10;
  code *req;
  uv_timer_t *puVar11;
  uv_process_options_t *loop_00;
  uv_stdio_container_t stdio [3];
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  undefined1 auStack_b20 [16];
  uint uStack_b10;
  undefined4 uStack_b08;
  undefined4 uStack_af8;
  undefined1 auStack_ae0 [284];
  char acStack_9c4 [4];
  uv_stdio_container_t uStack_9c0;
  uv_buf_t uStack_9a8;
  undefined1 auStack_998 [264];
  uv_fs_t uStack_890;
  uv_write_t uStack_6d8;
  anon_union_8_2_26168aa3_for_data aStack_618;
  uv_loop_t *puStack_610;
  anon_union_8_2_26168aa3_for_data aStack_608;
  anon_union_8_2_26168aa3_for_data aStack_600;
  code *apcStack_5f8 [2];
  char acStack_5e2 [10];
  anon_union_8_2_26168aa3_for_data aStack_5d8;
  sigset_t sStack_5b8;
  uv_loop_t *puStack_538;
  undefined1 auStack_530 [48];
  undefined1 auStack_500 [456];
  uv_loop_t *puStack_338;
  anon_union_8_2_26168aa3_for_data aStack_330;
  uv_buf_t local_328;
  uv_stdio_container_t local_318;
  undefined4 local_308;
  uv_loop_t *local_300;
  undefined1 local_2e8 [528];
  uv_write_t local_d8;
  
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b67f;
  init_process_options("spawn_helper3",exit_cb);
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b690;
  local_328 = uv_buf_init("TEST",4);
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b69e;
  puVar3 = uv_default_loop();
  puVar4 = (uv_loop_t *)local_2e8;
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b6b0;
  uv_pipe_init(puVar3,(uv_pipe_t *)puVar4,0);
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b6b5;
  puVar3 = uv_default_loop();
  aVar7.stream = (uv_stream_t *)(local_2e8 + 0x108);
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b6ca;
  uv_pipe_init(puVar3,(uv_pipe_t *)aVar7.stream,0);
  options.stdio = &local_318;
  local_318.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_308 = 0x21;
  options.stdio_count = 2;
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b701;
  local_318.data.stream = aVar7.stream;
  local_300 = puVar4;
  puVar3 = uv_default_loop();
  aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b713;
  iVar1 = uv_spawn(puVar3,&process,&options);
  if (iVar1 == 0) {
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b729;
    iVar1 = uv_process_kill(&process,0);
    if (iVar1 != 0) goto LAB_0016b804;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b755;
    iVar1 = uv_write(&local_d8,(uv_stream_t *)(local_2e8 + 0x108),&local_328,1,write_cb);
    if (iVar1 != 0) goto LAB_0016b809;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b775;
    iVar1 = uv_read_start((uv_stream_t *)local_2e8,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016b80e;
    if (exit_cb_called != 0) goto LAB_0016b813;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b78f;
    puVar3 = uv_default_loop();
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b799;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016b818;
    if (exit_cb_called != 1) goto LAB_0016b81d;
    if (output[4] != '\0' || output._0_4_ != 0x54534554) goto LAB_0016b822;
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b7c1;
    puVar4 = uv_default_loop();
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b7d5;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b7df;
    uv_run(puVar4,UV_RUN_DEFAULT);
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b7e4;
    puVar3 = uv_default_loop();
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b7ec;
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b804;
    run_test_spawn_same_stdout_stderr_cold_1();
LAB_0016b804:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b809;
    run_test_spawn_same_stdout_stderr_cold_2();
LAB_0016b809:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b80e;
    run_test_spawn_same_stdout_stderr_cold_3();
LAB_0016b80e:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b813;
    run_test_spawn_same_stdout_stderr_cold_4();
LAB_0016b813:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b818;
    run_test_spawn_same_stdout_stderr_cold_5();
LAB_0016b818:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b81d;
    run_test_spawn_same_stdout_stderr_cold_6();
LAB_0016b81d:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b822;
    run_test_spawn_same_stdout_stderr_cold_7();
LAB_0016b822:
    aStack_330 = (anon_union_8_2_26168aa3_for_data)0x16b827;
    run_test_spawn_same_stdout_stderr_cold_8();
  }
  aStack_330.stream = (uv_stream_t *)run_test_spawn_closed_process_io;
  run_test_spawn_same_stdout_stderr_cold_9();
  puStack_538 = (uv_loop_t *)0x16b849;
  puStack_338 = puVar4;
  aStack_330.stream = aVar7.stream;
  init_process_options("spawn_helper3",exit_cb);
  puStack_538 = (uv_loop_t *)0x16b84e;
  puVar3 = uv_default_loop();
  puVar4 = (uv_loop_t *)auStack_500;
  puStack_538 = (uv_loop_t *)0x16b860;
  uv_pipe_init(puVar3,(uv_pipe_t *)puVar4,0);
  options.stdio = (uv_stdio_container_t *)(auStack_530 + 0x10);
  loop_00 = &options;
  auStack_530._16_4_ = 0x11;
  options.stdio_count = 1;
  puStack_538 = (uv_loop_t *)0x16b88e;
  auStack_530._24_8_ = puVar4;
  close(0);
  puStack_538 = (uv_loop_t *)0x16b893;
  puVar3 = uv_default_loop();
  puStack_538 = (uv_loop_t *)0x16b8a5;
  iVar1 = uv_spawn(puVar3,&process,&options);
  if (iVar1 == 0) {
    puStack_538 = (uv_loop_t *)0x16b8be;
    auStack_530._0_16_ =
         (undefined1  [16])uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    puStack_538 = (uv_loop_t *)0x16b8e9;
    iVar1 = uv_write((uv_write_t *)(auStack_500 + 0x108),(uv_stream_t *)auStack_500,
                     (uv_buf_t *)auStack_530,1,write_cb);
    if (iVar1 != 0) goto LAB_0016b958;
    puStack_538 = (uv_loop_t *)0x16b8f2;
    puVar3 = uv_default_loop();
    puStack_538 = (uv_loop_t *)0x16b8fc;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016b95d;
    if (exit_cb_called != 1) goto LAB_0016b962;
    if (close_cb_called != 2) goto LAB_0016b967;
    puStack_538 = (uv_loop_t *)0x16b917;
    puVar4 = uv_default_loop();
    puStack_538 = (uv_loop_t *)0x16b92b;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_538 = (uv_loop_t *)0x16b935;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_538 = (uv_loop_t *)0x16b93a;
    puVar3 = uv_default_loop();
    puStack_538 = (uv_loop_t *)0x16b942;
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_538 = (uv_loop_t *)0x16b958;
    run_test_spawn_closed_process_io_cold_1();
LAB_0016b958:
    puStack_538 = (uv_loop_t *)0x16b95d;
    run_test_spawn_closed_process_io_cold_2();
LAB_0016b95d:
    puStack_538 = (uv_loop_t *)0x16b962;
    run_test_spawn_closed_process_io_cold_3();
LAB_0016b962:
    puStack_538 = (uv_loop_t *)0x16b967;
    run_test_spawn_closed_process_io_cold_4();
LAB_0016b967:
    puStack_538 = (uv_loop_t *)0x16b96c;
    run_test_spawn_closed_process_io_cold_5();
  }
  puStack_538 = (uv_loop_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  loop = (uv_process_options_t *)&sStack_5b8;
  puStack_538 = puVar4;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_5b8);
  sigaddset(&sStack_5b8,0xf);
  iVar1 = pthread_sigmask(0,&sStack_5b8,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    p_Var5 = signal(0xf,(__sighandler_t)0x1);
    if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016bacf;
    puVar4 = uv_default_loop();
    iVar1 = uv_spawn(puVar4,&process,&options);
    if (iVar1 != 0) goto LAB_0016bad4;
    sigemptyset(&sStack_5b8);
    sigaddset(&sStack_5b8,0xf);
    iVar1 = pthread_sigmask(1,&sStack_5b8,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_0016bad9;
    p_Var5 = signal(0xf,(__sighandler_t)0x0);
    if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016bade;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_0016bae3;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 != 0) goto LAB_0016bae8;
    puVar4 = uv_default_loop();
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016baed;
    if (exit_cb_called != 1) goto LAB_0016baf2;
    if (close_cb_called != 1) goto LAB_0016baf7;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_0016bacf:
    run_test_kill_cold_11();
LAB_0016bad4:
    run_test_kill_cold_2();
LAB_0016bad9:
    run_test_kill_cold_3();
LAB_0016bade:
    run_test_kill_cold_10();
LAB_0016bae3:
    run_test_kill_cold_4();
LAB_0016bae8:
    run_test_kill_cold_5();
LAB_0016baed:
    run_test_kill_cold_6();
LAB_0016baf2:
    run_test_kill_cold_7();
LAB_0016baf7:
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  apcStack_5f8[0] = (code *)0x16bb11;
  aStack_5d8 = (anon_union_8_2_26168aa3_for_data)loop;
  _Var2 = getuid();
  if (_Var2 != 0) {
    apcStack_5f8[0] = (code *)0x16bc38;
    run_test_spawn_setuid_setgid_cold_1();
    return 1;
  }
  apcStack_5f8[0] = (code *)0x16bb2c;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  apcStack_5f8[0] = (code *)0x16bb38;
  ppVar6 = getpwnam("nobody");
  if (ppVar6 == (passwd *)0x0) {
    apcStack_5f8[0] = (code *)0x16bc50;
    run_test_spawn_setuid_setgid_cold_8();
LAB_0016bc50:
    apcStack_5f8[0] = (code *)0x16bc55;
    run_test_spawn_setuid_setgid_cold_7();
LAB_0016bc55:
    apcStack_5f8[0] = (code *)0x16bc5a;
    run_test_spawn_setuid_setgid_cold_2();
LAB_0016bc5a:
    apcStack_5f8[0] = (code *)0x16bc5f;
    run_test_spawn_setuid_setgid_cold_3();
LAB_0016bc5f:
    apcStack_5f8[0] = (code *)0x16bc64;
    run_test_spawn_setuid_setgid_cold_4();
  }
  else {
    options.uid = ppVar6->pw_uid;
    options.gid = ppVar6->pw_gid;
    loop = &options;
    apcStack_5f8[0] = (code *)0x16bb74;
    snprintf(acStack_5e2,10,"%d");
    loop_00 = (uv_process_options_t *)((long)apcStack_5f8 + 0xc);
    apcStack_5f8[0] = (code *)0x16bb8f;
    snprintf((char *)loop_00,10,"%d",(ulong)ppVar6->pw_gid);
    options.args[2] = acStack_5e2;
    options.args[3] = (char *)loop_00;
    options.flags = 3;
    apcStack_5f8[0] = (code *)0x16bbb4;
    puVar4 = uv_default_loop();
    apcStack_5f8[0] = (code *)0x16bbc6;
    iVar1 = uv_spawn(puVar4,&process,&options);
    if (iVar1 != 0) {
      if (iVar1 == -0xd) {
        apcStack_5f8[0] = (code *)0x16bc44;
        run_test_spawn_setuid_setgid_cold_6();
        return 1;
      }
      goto LAB_0016bc50;
    }
    apcStack_5f8[0] = (code *)0x16bbcf;
    puVar4 = uv_default_loop();
    apcStack_5f8[0] = (code *)0x16bbd9;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016bc55;
    if (exit_cb_called != 1) goto LAB_0016bc5a;
    if (close_cb_called != 1) goto LAB_0016bc5f;
    apcStack_5f8[0] = (code *)0x16bbf4;
    loop_00 = (uv_process_options_t *)uv_default_loop();
    loop = (uv_process_options_t *)0x0;
    apcStack_5f8[0] = (code *)0x16bc0a;
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    apcStack_5f8[0] = (code *)0x16bc14;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    apcStack_5f8[0] = (code *)0x16bc19;
    puVar4 = uv_default_loop();
    apcStack_5f8[0] = (code *)0x16bc21;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  apcStack_5f8[0] = run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_5();
  aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bc6f;
  apcStack_5f8[0] = (code *)loop;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bc7f;
    aVar7.stream = (uv_stream_t *)getpwnam("nobody");
    if ((uv_loop_t *)aVar7.stream == (uv_loop_t *)0x0) goto LAB_0016bd5a;
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bc93;
    iVar1 = setgid(*(__gid_t *)&(aVar7.stream)->field_0x14);
    loop = (uv_process_options_t *)aVar7.stream;
    if (iVar1 != 0) goto LAB_0016bd5f;
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bca3;
    iVar1 = setuid((aVar7.stream)->type);
    if (iVar1 == 0) goto LAB_0016bcab;
  }
  else {
LAB_0016bcab:
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bcbe;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options._56_8_ = options._56_8_ & 0xffffffff00000000;
    options.flags = options.flags | 0x75;
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bcdb;
    puVar4 = uv_default_loop();
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bced;
    iVar1 = uv_spawn(puVar4,&process,&options);
    if (iVar1 == -1) {
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bcf7;
      puVar4 = uv_default_loop();
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd01;
      iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_0016bd4b;
      if (close_cb_called != 0) goto LAB_0016bd50;
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd13;
      loop = (uv_process_options_t *)uv_default_loop();
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd27;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd31;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd36;
      puVar4 = uv_default_loop();
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd3e;
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd4b;
      run_test_spawn_setuid_fails_cold_3();
LAB_0016bd4b:
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd50;
      run_test_spawn_setuid_fails_cold_4();
LAB_0016bd50:
      aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd55;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd5a;
    run_test_spawn_setuid_fails_cold_6();
LAB_0016bd5a:
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd5f;
    run_test_spawn_setuid_fails_cold_7();
LAB_0016bd5f:
    aStack_600 = (anon_union_8_2_26168aa3_for_data)0x16bd64;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_600.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bd6f;
  aStack_600 = (anon_union_8_2_26168aa3_for_data)loop;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bd7f;
    aVar7.stream = (uv_stream_t *)getpwnam("nobody");
    if ((uv_loop_t *)aVar7.stream == (uv_loop_t *)0x0) goto LAB_0016be5a;
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bd93;
    iVar1 = setgid(*(__gid_t *)&(aVar7.stream)->field_0x14);
    loop = (uv_process_options_t *)aVar7.stream;
    if (iVar1 != 0) goto LAB_0016be5f;
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bda3;
    iVar1 = setuid((aVar7.stream)->type);
    if (iVar1 == 0) goto LAB_0016bdab;
  }
  else {
LAB_0016bdab:
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bdbe;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.flags = options.flags | 2;
    options._56_8_ = options._56_8_ & 0xffffffff;
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bddb;
    puVar4 = uv_default_loop();
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bded;
    iVar1 = uv_spawn(puVar4,&process,&options);
    if (iVar1 == -1) {
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16bdf7;
      puVar4 = uv_default_loop();
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be01;
      iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_0016be4b;
      if (close_cb_called != 0) goto LAB_0016be50;
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be13;
      loop = (uv_process_options_t *)uv_default_loop();
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be27;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be31;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be36;
      puVar4 = uv_default_loop();
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be3e;
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be4b;
      run_test_spawn_setgid_fails_cold_3();
LAB_0016be4b:
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be50;
      run_test_spawn_setgid_fails_cold_4();
LAB_0016be50:
      aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be55;
      run_test_spawn_setgid_fails_cold_5();
    }
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be5a;
    run_test_spawn_setgid_fails_cold_6();
LAB_0016be5a:
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be5f;
    run_test_spawn_setgid_fails_cold_7();
LAB_0016be5f:
    aStack_608 = (anon_union_8_2_26168aa3_for_data)0x16be64;
    run_test_spawn_setgid_fails_cold_1();
  }
  aStack_608.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_setgid_fails_cold_2();
  puStack_610 = (uv_loop_t *)0x16be78;
  aStack_608 = (anon_union_8_2_26168aa3_for_data)loop;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_610 = (uv_loop_t *)0x16be7d;
  puVar4 = uv_default_loop();
  puStack_610 = (uv_loop_t *)0x16be93;
  iVar1 = uv_spawn(puVar4,&process,&options);
  if (iVar1 == 0) {
    puStack_610 = (uv_loop_t *)0x16bea0;
    puVar4 = uv_default_loop();
    puStack_610 = (uv_loop_t *)0x16beaa;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016bf2d;
    puStack_610 = (uv_loop_t *)0x16beba;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 0) goto LAB_0016bf32;
    puStack_610 = (uv_loop_t *)0x16becc;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puStack_610 = (uv_loop_t *)0x16bed1;
    puVar4 = uv_default_loop();
    puStack_610 = (uv_loop_t *)0x16bedb;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016bf37;
    puStack_610 = (uv_loop_t *)0x16beeb;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 1) goto LAB_0016bf3c;
    puStack_610 = (uv_loop_t *)0x16bef5;
    loop = (uv_process_options_t *)uv_default_loop();
    puStack_610 = (uv_loop_t *)0x16bf09;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_610 = (uv_loop_t *)0x16bf13;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_610 = (uv_loop_t *)0x16bf18;
    puVar4 = uv_default_loop();
    puStack_610 = (uv_loop_t *)0x16bf20;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_610 = (uv_loop_t *)0x16bf2d;
    run_test_spawn_auto_unref_cold_1();
LAB_0016bf2d:
    puStack_610 = (uv_loop_t *)0x16bf32;
    run_test_spawn_auto_unref_cold_2();
LAB_0016bf32:
    puStack_610 = (uv_loop_t *)0x16bf37;
    run_test_spawn_auto_unref_cold_3();
LAB_0016bf37:
    puStack_610 = (uv_loop_t *)0x16bf3c;
    run_test_spawn_auto_unref_cold_4();
LAB_0016bf3c:
    puStack_610 = (uv_loop_t *)0x16bf41;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_610 = (uv_loop_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  req = (code *)&uStack_890;
  auStack_ae0._264_8_ = 0x16bf71;
  aStack_618 = (anon_union_8_2_26168aa3_for_data)loop;
  puStack_610 = (uv_loop_t *)loop_00;
  acStack_9c4 = (char  [4])uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)req,"/dev/null",2,0,(uv_fs_cb)0x0)
  ;
  if ((int)acStack_9c4 < 0) {
    auStack_ae0._264_8_ = 0x16c0ce;
    run_test_spawn_fs_open_cold_1();
LAB_0016c0ce:
    auStack_ae0._264_8_ = 0x16c0d3;
    run_test_spawn_fs_open_cold_2();
LAB_0016c0d3:
    auStack_ae0._264_8_ = 0x16c0d8;
    run_test_spawn_fs_open_cold_3();
LAB_0016c0d8:
    auStack_ae0._264_8_ = 0x16c0dd;
    run_test_spawn_fs_open_cold_4();
LAB_0016c0dd:
    auStack_ae0._264_8_ = 0x16c0e2;
    run_test_spawn_fs_open_cold_5();
LAB_0016c0e2:
    auStack_ae0._264_8_ = 0x16c0e7;
    run_test_spawn_fs_open_cold_6();
LAB_0016c0e7:
    auStack_ae0._264_8_ = 0x16c0ec;
    run_test_spawn_fs_open_cold_7();
LAB_0016c0ec:
    auStack_ae0._264_8_ = 0x16c0f1;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    auStack_ae0._264_8_ = 0x16bf8a;
    uv_fs_req_cleanup(&uStack_890);
    auStack_ae0._264_8_ = 0x16bf9d;
    init_process_options("spawn_helper8",exit_cb);
    auStack_ae0._264_8_ = 0x16bfa2;
    puVar4 = uv_default_loop();
    loop = (uv_process_options_t *)auStack_998;
    auStack_ae0._264_8_ = 0x16bfb4;
    req = (code *)loop;
    iVar1 = uv_pipe_init(puVar4,(uv_pipe_t *)loop,0);
    if (iVar1 != 0) goto LAB_0016c0ce;
    options.stdio = &uStack_9c0;
    uStack_9c0.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    auStack_ae0._264_8_ = 0x16bfe8;
    uStack_9c0.data.stream = (uv_stream_t *)loop;
    puVar4 = uv_default_loop();
    puVar9 = &process;
    auStack_ae0._264_8_ = 0x16bffa;
    iVar1 = uv_spawn(puVar4,&process,&options);
    req = (code *)puVar9;
    if (iVar1 != 0) goto LAB_0016c0d3;
    auStack_ae0._264_8_ = 0x16c011;
    uStack_9a8 = uv_buf_init(acStack_9c4,4);
    req = (code *)auStack_998;
    auStack_ae0._264_8_ = 0x16c03e;
    iVar1 = uv_write(&uStack_6d8,(uv_stream_t *)req,&uStack_9a8,1,write_cb);
    if (iVar1 != 0) goto LAB_0016c0d8;
    auStack_ae0._264_8_ = 0x16c04b;
    puVar4 = uv_default_loop();
    req = (code *)0x0;
    auStack_ae0._264_8_ = 0x16c055;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016c0dd;
    req = (code *)&uStack_890;
    auStack_ae0._264_8_ = 0x16c072;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)req,(uv_file)acStack_9c4,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0016c0e2;
    if (exit_cb_called != 1) goto LAB_0016c0e7;
    if (close_cb_called != 2) goto LAB_0016c0ec;
    auStack_ae0._264_8_ = 0x16c08d;
    loop = (uv_process_options_t *)uv_default_loop();
    auStack_ae0._264_8_ = 0x16c0a1;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    req = (code *)0x0;
    auStack_ae0._264_8_ = 0x16c0ab;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    auStack_ae0._264_8_ = 0x16c0b0;
    puVar4 = uv_default_loop();
    auStack_ae0._264_8_ = 0x16c0b8;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  auStack_ae0._264_8_ = run_test_closed_fd_events;
  run_test_spawn_fs_open_cold_9();
  puVar9 = (uv_process_t *)auStack_b20;
  auStack_ae0._264_8_ = loop;
  iVar1 = pipe((int *)puVar9);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = (uv_stdio_container_t *)(auStack_b20 + 8);
    auStack_b20._8_4_ = 2;
    uStack_b10 = auStack_b20._0_4_;
    uStack_b08 = 0;
    uStack_af8 = 0;
    puVar9 = (uv_process_t *)uv_default_loop();
    puVar10 = &process;
    iVar1 = uv_spawn((uv_loop_t *)puVar9,&process,&options);
    req = (code *)puVar10;
    if (iVar1 != 0) goto LAB_0016c33a;
    uv_unref((uv_handle_t *)&process);
    puVar9 = (uv_process_t *)uv_default_loop();
    req = (code *)auStack_ae0;
    iVar1 = uv_pipe_init((uv_loop_t *)puVar9,(uv_pipe_t *)req,0);
    if (iVar1 != 0) goto LAB_0016c33f;
    req._4_4_ = 0;
    req._0_4_ = auStack_b20._0_4_;
    puVar9 = (uv_process_t *)auStack_ae0;
    iVar1 = uv_pipe_open((uv_pipe_t *)puVar9,auStack_b20._0_4_);
    if (iVar1 != 0) goto LAB_0016c344;
    auStack_b20._0_4_ = 0xffffffff;
    req = on_alloc;
    puVar9 = (uv_process_t *)auStack_ae0;
    iVar1 = uv_read_start((uv_stream_t *)puVar9,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_0016c349;
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_b20._4_4_;
    req = (code *)0x1902f1;
    sVar8 = write(auStack_b20._4_4_,"",1);
    if (sVar8 != 1) goto LAB_0016c34e;
    puVar9 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)puVar9,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_0016c353;
    if (output_used != 1) goto LAB_0016c358;
    uv_close((uv_handle_t *)auStack_ae0,close_cb);
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_b20._4_4_;
    req = (code *)0x1902f1;
    sVar8 = write(auStack_b20._4_4_,"",1);
    if (sVar8 != 1) goto LAB_0016c35d;
    puVar9 = (uv_process_t *)uv_default_loop();
    puVar11 = &timer;
    iVar1 = uv_timer_init((uv_loop_t *)puVar9,&timer);
    req = (code *)puVar11;
    if (iVar1 != 0) goto LAB_0016c362;
    puVar11 = &timer;
    req = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    puVar9 = (uv_process_t *)puVar11;
    if (iVar1 != 0) goto LAB_0016c367;
    puVar9 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)puVar9,UV_RUN_ONCE);
    if (iVar1 == 1) {
      puVar9 = (uv_process_t *)uv_default_loop();
      req = (code *)0x1;
      iVar1 = uv_run((uv_loop_t *)puVar9,UV_RUN_ONCE);
      if (iVar1 != 0) goto LAB_0016c380;
    }
    if (timer_counter != 1) goto LAB_0016c36c;
    puVar9 = &process;
    req = (code *)0xf;
    iVar1 = uv_process_kill(&process,0xf);
    if (iVar1 != 0) goto LAB_0016c371;
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_b20._4_4_;
    iVar1 = close(auStack_b20._4_4_);
    if (iVar1 != 0) goto LAB_0016c376;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    req = (code *)0x0;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar9 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)puVar9);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0016c33a:
    run_test_closed_fd_events_cold_2();
LAB_0016c33f:
    run_test_closed_fd_events_cold_3();
LAB_0016c344:
    run_test_closed_fd_events_cold_4();
LAB_0016c349:
    run_test_closed_fd_events_cold_5();
LAB_0016c34e:
    run_test_closed_fd_events_cold_6();
LAB_0016c353:
    run_test_closed_fd_events_cold_7();
LAB_0016c358:
    run_test_closed_fd_events_cold_8();
LAB_0016c35d:
    run_test_closed_fd_events_cold_9();
LAB_0016c362:
    run_test_closed_fd_events_cold_10();
LAB_0016c367:
    run_test_closed_fd_events_cold_11();
LAB_0016c36c:
    run_test_closed_fd_events_cold_13();
LAB_0016c371:
    run_test_closed_fd_events_cold_14();
LAB_0016c376:
    run_test_closed_fd_events_cold_15();
  }
  run_test_closed_fd_events_cold_16();
LAB_0016c380:
  run_test_closed_fd_events_cold_12();
  uv_read_stop((uv_stream_t *)puVar9);
  on_read((uv_stream_t *)puVar9,(ssize_t)req,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_same_stdout_stderr) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[3];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*)&in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*)&out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&in, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&out, on_alloc, on_read);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(strcmp(output, "TEST") == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}